

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::GetItemReference
               (Var instance,RecyclableObject *propertyObject,uint32 index,Var *value,
               ScriptContext *requestContext)

{
  BOOL BVar1;
  PropertyQueryFlags val;
  RecyclableObject *pRVar2;
  RecyclableObject *pRStack_40;
  PropertyQueryFlags result;
  RecyclableObject *object;
  ScriptContext *requestContext_local;
  Var *value_local;
  uint32 index_local;
  RecyclableObject *propertyObject_local;
  Var instance_local;
  
  pRStack_40 = propertyObject;
  while (BVar1 = IsNull(pRStack_40), BVar1 == 0) {
    val = (*(pRStack_40->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x27])
                    (pRStack_40,instance,(ulong)index,value,requestContext);
    if (val != Property_NotFound) {
      BVar1 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
      return BVar1;
    }
    BVar1 = RecyclableObject::SkipsPrototype(pRStack_40);
    if (BVar1 != 0) break;
    pRStack_40 = GetPrototypeNoTrap(pRStack_40);
  }
  pRVar2 = ScriptContext::GetMissingItemResult(requestContext);
  *value = pRVar2;
  return 0;
}

Assistant:

BOOL JavascriptOperators::GetItemReference(Var instance, RecyclableObject* propertyObject, uint32 index, Var* value, ScriptContext* requestContext)
    {
        RecyclableObject* object = propertyObject;
        while (!JavascriptOperators::IsNull(object))
        {
            PropertyQueryFlags result;
            if ((result = object->GetItemReferenceQuery(instance, index, value, requestContext)) != PropertyQueryFlags::Property_NotFound)
            {
                return JavascriptConversion::PropertyQueryFlagsToBoolean(result);
            }
            if (object->SkipsPrototype())
            {
                break;
            }
            object = JavascriptOperators::GetPrototypeNoTrap(object);
        }
        *value = requestContext->GetMissingItemResult();
        return false;
    }